

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseTextureClampTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::SparseTextureClampLookupResidencyTestCase::verifyLookupTextureData
          (SparseTextureClampLookupResidencyTestCase *this,Functions *gl,GLint target,GLint format,
          GLuint *texture,GLint level,FunctionToken *funcToken)

{
  pointer *this_00;
  glUseProgramFunc p_Var1;
  undefined *puVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  GLenum GVar6;
  deUint32 dVar7;
  ostream *poVar8;
  TestError *this_01;
  uchar *ptr;
  GLchar *pGVar9;
  char *pcVar10;
  RenderContext *renderCtx;
  ShaderInfo *pSVar11;
  ProgramInfo *pPVar12;
  GLubyte *outDataRegion;
  GLubyte *dataRegion;
  GLint x;
  GLint y;
  ShaderProgram program;
  string local_610;
  allocator<char> local_5e9;
  string local_5e8;
  undefined1 local_5c8 [8];
  ProgramSources sources;
  string local_4d8;
  string local_4b8;
  undefined1 local_498 [8];
  TokenStringsExt s;
  undefined1 local_170 [8];
  string fragment;
  undefined1 local_148 [8];
  string vertex;
  int local_120;
  int sample;
  GLint z;
  GLuint fbo;
  GLuint verifyTexture;
  GLint verifyTarget;
  FunctionToken f;
  GLubyte *out_data;
  GLubyte *exp_data;
  vector<unsigned_char,_std::allocator<unsigned_char>_> vecOutData;
  vector<unsigned_char,_std::allocator<unsigned_char>_> vecExpData;
  byte local_55;
  GLint texSize;
  GLuint GStack_50;
  bool result;
  GLint widthCommitted;
  GLint depth;
  GLint height;
  GLint width;
  GLint local_34;
  GLuint *pGStack_30;
  GLint level_local;
  GLuint *texture_local;
  GLint format_local;
  GLint target_local;
  Functions *gl_local;
  SparseTextureClampLookupResidencyTestCase *this_local;
  
  local_34 = level;
  pGStack_30 = texture;
  texture_local._0_4_ = format;
  texture_local._4_4_ = target;
  _format_local = gl;
  gl_local = (Functions *)this;
  poVar8 = std::operator<<((ostream *)
                           &(this->super_SparseTexture2LookupTestCase).
                            super_SparseTexture2CommitmentTestCase.
                            super_SparseTextureCommitmentTestCase.field_0x88,
                           "Verify Lookup Residency Texture Data [function: ");
  poVar8 = std::operator<<(poVar8,(string *)funcToken);
  poVar8 = std::operator<<(poVar8,", level: ");
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,local_34);
  std::operator<<(poVar8,"] - ");
  if (local_34 <=
      (this->super_SparseTexture2LookupTestCase).super_SparseTexture2CommitmentTestCase.
      super_SparseTextureCommitmentTestCase.mState.levels + -1) {
    SparseTextureUtils::getTextureLevelSize
              (texture_local._4_4_,
               &(this->super_SparseTexture2LookupTestCase).super_SparseTexture2CommitmentTestCase.
                super_SparseTextureCommitmentTestCase.mState,local_34,&depth,&widthCommitted,
               (GLint *)&stack0xffffffffffffffb0);
    iVar4 = depth / 2;
    if (((iVar4 == 0) || (widthCommitted == 0)) ||
       ((int)GStack_50 <
        (this->super_SparseTexture2LookupTestCase).super_SparseTexture2CommitmentTestCase.
        super_SparseTextureCommitmentTestCase.mState.minDepth)) {
      this_local._7_1_ = 1;
    }
    else {
      local_55 = 1;
      if (texture_local._4_4_ == 0x8513) {
        GStack_50 = GStack_50 * 6;
      }
      iVar5 = depth * widthCommitted;
      this_00 = &vecOutData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this_00);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&exp_data);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this_00,(long)iVar5);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&exp_data,(long)iVar5);
      ptr = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                       &vecOutData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
      f.allowedTargets._M_t._M_impl.super__Rb_tree_header._M_node_count =
           (size_t)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                             ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&exp_data);
      ::deMemset(ptr,0xff,(long)iVar5);
      SparseTexture2LookupTestCase::FunctionToken::FunctionToken
                ((FunctionToken *)&verifyTexture,funcToken);
      fbo = 0xde1;
      gl4cts::Texture::Generate(_format_local,(GLuint *)&z);
      gl4cts::Texture::Bind(_format_local,z,fbo);
      gl4cts::Texture::Storage(_format_local,fbo,1,0x8229,depth,widthCommitted,GStack_50);
      GVar6 = (*_format_local->getError)();
      glu::checkError(GVar6,"Texture::Storage",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTextureClampTests.cpp"
                      ,0x148);
      (*_format_local->genFramebuffers)(1,(GLuint *)&sample);
      GVar6 = (*_format_local->getError)();
      glu::checkError(GVar6,"glGenFramebuffers",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTextureClampTests.cpp"
                      ,0x14c);
      (*_format_local->bindFramebuffer)(0x8d40,sample);
      GVar6 = (*_format_local->getError)();
      glu::checkError(GVar6,"glBindFramebuffer",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTextureClampTests.cpp"
                      ,0x14e);
      (*_format_local->framebufferTexture2D)(0x8d40,0x8ce0,fbo,z,0);
      GVar6 = (*_format_local->getError)();
      glu::checkError(GVar6,"glFramebufferTexture2D",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTextureClampTests.cpp"
                      ,0x150);
      (*_format_local->viewport)(0,0,depth,widthCommitted);
      for (local_120 = 0; local_120 < (int)GStack_50; local_120 = local_120 + 1) {
        for (vertex.field_2._12_4_ = 0;
            (int)vertex.field_2._12_4_ <
            (this->super_SparseTexture2LookupTestCase).super_SparseTexture2CommitmentTestCase.
            super_SparseTextureCommitmentTestCase.mState.samples;
            vertex.field_2._12_4_ = vertex.field_2._12_4_ + 1) {
          ::deMemset((void *)f.allowedTargets._M_t._M_impl.super__Rb_tree_header._M_node_count,0,
                     (long)iVar5);
          gl4cts::Texture::Bind(_format_local,z,fbo);
          gl4cts::Texture::SubImage
                    (_format_local,fbo,0,0,0,0,depth,widthCommitted,0,0x1903,0x1401,
                     (GLvoid *)f.allowedTargets._M_t._M_impl.super__Rb_tree_header._M_node_count);
          GVar6 = (*_format_local->getError)();
          glu::checkError(GVar6,"Texture::SubImage",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTextureClampTests.cpp"
                          ,0x15d);
          puVar2 = stc_vertex_common;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_148,puVar2,
                     (allocator<char> *)(fragment.field_2._M_local_buf + 0xf));
          std::allocator<char>::~allocator((allocator<char> *)(fragment.field_2._M_local_buf + 0xf))
          ;
          puVar2 = stc_fragment_lookupResidency;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_170,puVar2,
                     (allocator<char> *)(s.pointCoord.field_2._M_local_buf + 0xf));
          std::allocator<char>::~allocator
                    ((allocator<char> *)(s.pointCoord.field_2._M_local_buf + 0xf));
          SparseTexture2LookupTestCase::createLookupShaderTokens
                    ((TokenStringsExt *)local_498,&this->super_SparseTexture2LookupTestCase,
                     texture_local._4_4_,(GLint)texture_local,local_34,vertex.field_2._12_4_,
                     (FunctionToken *)&verifyTexture);
          pGVar9 = (GLchar *)std::__cxx11::string::c_str();
          replaceToken("<COORD_TYPE>",pGVar9,(string *)local_148);
          pGVar9 = (GLchar *)std::__cxx11::string::c_str();
          replaceToken("<FUNCTION>",pGVar9,(string *)local_170);
          pGVar9 = (GLchar *)std::__cxx11::string::c_str();
          replaceToken("<ARGUMENTS>",pGVar9,(string *)local_170);
          pGVar9 = (GLchar *)std::__cxx11::string::c_str();
          replaceToken("<OUTPUT_TYPE>",pGVar9,(string *)local_170);
          pGVar9 = (GLchar *)std::__cxx11::string::c_str();
          replaceToken("<INPUT_TYPE>",pGVar9,(string *)local_170);
          pGVar9 = (GLchar *)std::__cxx11::string::c_str();
          replaceToken("<SIZE_DEF>",pGVar9,(string *)local_170);
          pGVar9 = (GLchar *)std::__cxx11::string::c_str();
          replaceToken("<LOD>",pGVar9,(string *)local_170);
          pGVar9 = (GLchar *)std::__cxx11::string::c_str();
          replaceToken("<LOD_DEF>",pGVar9,(string *)local_170);
          pGVar9 = (GLchar *)std::__cxx11::string::c_str();
          replaceToken("<COORD_TYPE>",pGVar9,(string *)local_170);
          pGVar9 = (GLchar *)std::__cxx11::string::c_str();
          replaceToken("<ICOORD_TYPE>",pGVar9,(string *)local_170);
          pGVar9 = (GLchar *)std::__cxx11::string::c_str();
          replaceToken("<COORD_DEF>",pGVar9,(string *)local_170);
          pGVar9 = (GLchar *)std::__cxx11::string::c_str();
          replaceToken("<POINT_TYPE>",pGVar9,(string *)local_170);
          pGVar9 = (GLchar *)std::__cxx11::string::c_str();
          replaceToken("<POINT_DEF>",pGVar9,(string *)local_170);
          pGVar9 = (GLchar *)std::__cxx11::string::c_str();
          replaceToken("<RETURN_TYPE>",pGVar9,(string *)local_170);
          pGVar9 = (GLchar *)std::__cxx11::string::c_str();
          replaceToken("<RESULT_EXPECTED>",pGVar9,(string *)local_170);
          pGVar9 = (GLchar *)std::__cxx11::string::c_str();
          replaceToken("<EPSILON>",pGVar9,(string *)local_170);
          pGVar9 = (GLchar *)std::__cxx11::string::c_str();
          replaceToken("<SAMPLE_DEF>",pGVar9,(string *)local_170);
          pGVar9 = (GLchar *)std::__cxx11::string::c_str();
          replaceToken("<REFZ_DEF>",pGVar9,(string *)local_170);
          pGVar9 = (GLchar *)std::__cxx11::string::c_str();
          replaceToken("<POINT_COORD>",pGVar9,(string *)local_170);
          pGVar9 = (GLchar *)std::__cxx11::string::c_str();
          replaceToken("<COMPONENT_DEF>",pGVar9,(string *)local_170);
          pGVar9 = (GLchar *)std::__cxx11::string::c_str();
          replaceToken("<CUBE_MAP_COORD_DEF>",pGVar9,(string *)local_170);
          pGVar9 = (GLchar *)std::__cxx11::string::c_str();
          replaceToken("<OFFSET_ARRAY_DEF>",pGVar9,(string *)local_170);
          pGVar9 = (GLchar *)std::__cxx11::string::c_str();
          replaceToken("<FORMAT_DEF>",pGVar9,(string *)local_170);
          pGVar9 = (GLchar *)std::__cxx11::string::c_str();
          replaceToken("<OFFSET_TYPE>",pGVar9,(string *)local_170);
          pGVar9 = (GLchar *)std::__cxx11::string::c_str();
          replaceToken("<NOFFSET_TYPE>",pGVar9,(string *)local_170);
          pGVar9 = (GLchar *)std::__cxx11::string::c_str();
          replaceToken("<OFFSET_DIM>",pGVar9,(string *)local_170);
          de::toString<int>(&local_4b8,&depth);
          pGVar9 = (GLchar *)std::__cxx11::string::c_str();
          replaceToken("<TEX_WIDTH>",pGVar9,(string *)local_170);
          std::__cxx11::string::~string((string *)&local_4b8);
          de::toString<int>(&local_4d8,&widthCommitted);
          pGVar9 = (GLchar *)std::__cxx11::string::c_str();
          replaceToken("<TEX_HEIGHT>",pGVar9,(string *)local_170);
          std::__cxx11::string::~string((string *)&local_4d8);
          de::toString<int>((string *)&sources.separable,(int *)&stack0xffffffffffffffb0);
          pGVar9 = (GLchar *)std::__cxx11::string::c_str();
          replaceToken("<TEX_DEPTH>",pGVar9,(string *)local_170);
          std::__cxx11::string::~string((string *)&sources.separable);
          pcVar10 = (char *)std::__cxx11::string::c_str();
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_5e8,pcVar10,&local_5e9);
          pcVar10 = (char *)std::__cxx11::string::c_str();
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_610,pcVar10,
                     (allocator<char> *)((long)&program.m_program.m_info.linkTimeUs + 7));
          glu::makeVtxFragSources((ProgramSources *)local_5c8,&local_5e8,&local_610);
          std::__cxx11::string::~string((string *)&local_610);
          std::allocator<char>::~allocator
                    ((allocator<char> *)((long)&program.m_program.m_info.linkTimeUs + 7));
          std::__cxx11::string::~string((string *)&local_5e8);
          std::allocator<char>::~allocator(&local_5e9);
          renderCtx = deqp::Context::getRenderContext
                                ((this->super_SparseTexture2LookupTestCase).
                                 super_SparseTexture2CommitmentTestCase.
                                 super_SparseTextureCommitmentTestCase.super_TestCase.m_context);
          glu::ShaderProgram::ShaderProgram
                    ((ShaderProgram *)&x,renderCtx,(ProgramSources *)local_5c8);
          bVar3 = glu::ShaderProgram::isOk((ShaderProgram *)&x);
          if (bVar3) {
            p_Var1 = _format_local->useProgram;
            dVar7 = glu::ShaderProgram::getProgram((ShaderProgram *)&x);
            (*p_Var1)(dVar7);
            GVar6 = (*_format_local->getError)();
            glu::checkError(GVar6,"glUseProgram",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTextureClampTests.cpp"
                            ,0x18d);
            (*_format_local->activeTexture)(0x84c0);
            GVar6 = (*_format_local->getError)();
            glu::checkError(GVar6,"glActiveTexture",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTextureClampTests.cpp"
                            ,0x191);
            (*_format_local->uniform1i)(1,0);
            GVar6 = (*_format_local->getError)();
            glu::checkError(GVar6,"glUniform1i",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTextureClampTests.cpp"
                            ,0x193);
            (*_format_local->uniform1i)(2,iVar4);
            GVar6 = (*_format_local->getError)();
            glu::checkError(GVar6,"glUniform1i",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTextureClampTests.cpp"
                            ,0x197);
            (*_format_local->bindTexture)(texture_local._4_4_,*pGStack_30);
            GVar6 = (*_format_local->getError)();
            glu::checkError(GVar6,"glBindTexture",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTextureClampTests.cpp"
                            ,0x19a);
            (*_format_local->clear)(0x4100);
            (**(code **)((long)(this->super_SparseTexture2LookupTestCase).
                               super_SparseTexture2CommitmentTestCase.
                               super_SparseTextureCommitmentTestCase.super_TestCase.super_TestCase.
                               super_TestNode._vptr_TestNode + 0xa0))
                      (this,texture_local._4_4_,local_120,&x);
            gl4cts::Texture::Bind(_format_local,z,fbo);
            gl4cts::Texture::GetData
                      (_format_local,0,fbo,0x1903,0x1401,
                       (GLvoid *)f.allowedTargets._M_t._M_impl.super__Rb_tree_header._M_node_count);
            GVar6 = (*_format_local->getError)();
            glu::checkError(GVar6,"Texture::GetData",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTextureClampTests.cpp"
                            ,0x1a1);
            for (dataRegion._4_4_ = 0; dataRegion._4_4_ < widthCommitted;
                dataRegion._4_4_ = dataRegion._4_4_ + 1) {
              for (dataRegion._0_4_ = 0; (int)dataRegion < depth;
                  dataRegion._0_4_ = (int)dataRegion + 1) {
                if (ptr[(long)(dataRegion._4_4_ * depth) + (long)(int)dataRegion] !=
                    *(uchar *)(f.allowedTargets._M_t._M_impl.super__Rb_tree_header._M_node_count +
                               (long)(int)dataRegion + (long)(dataRegion._4_4_ * depth))) {
                  local_55 = 0;
                }
              }
            }
          }
          else {
            poVar8 = std::operator<<((ostream *)
                                     &(this->super_SparseTexture2LookupTestCase).
                                      super_SparseTexture2CommitmentTestCase.
                                      super_SparseTextureCommitmentTestCase.field_0x88,
                                     "Shader compilation failed (lookup residency) for target: ");
            poVar8 = (ostream *)std::ostream::operator<<(poVar8,texture_local._4_4_);
            poVar8 = std::operator<<(poVar8,", format: ");
            poVar8 = (ostream *)std::ostream::operator<<(poVar8,(GLint)texture_local);
            poVar8 = std::operator<<(poVar8,", vertexInfoLog: ");
            pSVar11 = glu::ShaderProgram::getShaderInfo((ShaderProgram *)&x,SHADERTYPE_VERTEX,0);
            poVar8 = std::operator<<(poVar8,(string *)&pSVar11->infoLog);
            poVar8 = std::operator<<(poVar8,", fragmentInfoLog: ");
            pSVar11 = glu::ShaderProgram::getShaderInfo((ShaderProgram *)&x,SHADERTYPE_FRAGMENT,0);
            poVar8 = std::operator<<(poVar8,(string *)&pSVar11->infoLog);
            poVar8 = std::operator<<(poVar8,", programInfoLog: ");
            pPVar12 = glu::ShaderProgram::getProgramInfo((ShaderProgram *)&x);
            poVar8 = std::operator<<(poVar8,(string *)pPVar12);
            poVar8 = std::operator<<(poVar8,", fragmentSource: ");
            pcVar10 = (char *)std::__cxx11::string::c_str();
            poVar8 = std::operator<<(poVar8,pcVar10);
            std::operator<<(poVar8," - ");
            local_55 = 0;
          }
          glu::ShaderProgram::~ShaderProgram((ShaderProgram *)&x);
          glu::ProgramSources::~ProgramSources((ProgramSources *)local_5c8);
          SparseTexture2LookupTestCase::TokenStringsExt::~TokenStringsExt
                    ((TokenStringsExt *)local_498);
          std::__cxx11::string::~string((string *)local_170);
          std::__cxx11::string::~string((string *)local_148);
        }
      }
      (*_format_local->bindFramebuffer)(0x8d40,0);
      GVar6 = (*_format_local->getError)();
      glu::checkError(GVar6,"glBindFramebuffer",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTextureClampTests.cpp"
                      ,0x1bb);
      gl4cts::Texture::Delete(_format_local,(GLuint *)&z);
      this_local._7_1_ = local_55;
      SparseTexture2LookupTestCase::FunctionToken::~FunctionToken((FunctionToken *)&verifyTexture);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&exp_data);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                 &vecOutData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    return (bool)(this_local._7_1_ & 1);
  }
  this_01 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_01,"Invalid level",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTextureClampTests.cpp"
             ,0x121);
  __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

bool SparseTextureClampLookupResidencyTestCase::verifyLookupTextureData(const Functions& gl, GLint target, GLint format,
																		GLuint& texture, GLint level,
																		FunctionToken& funcToken)
{
	mLog << "Verify Lookup Residency Texture Data [function: " << funcToken.name << ", level: " << level << "] - ";

	if (level > mState.levels - 1)
		TCU_FAIL("Invalid level");

	GLint width;
	GLint height;
	GLint depth;
	SparseTextureUtils::getTextureLevelSize(target, mState, level, width, height, depth);

	//Committed region is limited to 1/2 of width
	GLint widthCommitted = width / 2;

	if (widthCommitted == 0 || height == 0 || depth < mState.minDepth)
		return true;

	bool result = true;

	if (target == GL_TEXTURE_CUBE_MAP)
		depth = depth * 6;

	GLint texSize = width * height;

	std::vector<GLubyte> vecExpData;
	std::vector<GLubyte> vecOutData;
	vecExpData.resize(texSize);
	vecOutData.resize(texSize);
	GLubyte* exp_data = vecExpData.data();
	GLubyte* out_data = vecOutData.data();

	// Expected data is 255 because
	deMemset(exp_data, 255, texSize);

	// Make token copy to work on
	FunctionToken f = funcToken;

	// Create verifying texture
	GLint  verifyTarget = GL_TEXTURE_2D;
	GLuint verifyTexture;
	Texture::Generate(gl, verifyTexture);
	Texture::Bind(gl, verifyTexture, verifyTarget);
	Texture::Storage(gl, verifyTarget, 1, GL_R8, width, height, depth);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Texture::Storage");

	GLuint fbo;
	gl.genFramebuffers(1, &fbo);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenFramebuffers");
	gl.bindFramebuffer(GL_FRAMEBUFFER, fbo);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindFramebuffer");
	gl.framebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, verifyTarget, verifyTexture, 0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glFramebufferTexture2D");

	gl.viewport(0, 0, width, height);

	for (GLint z = 0; z < depth; ++z)
	{
		for (int sample = 0; sample < mState.samples; ++sample)
		{
			deMemset(out_data, 0, texSize);

			Texture::Bind(gl, verifyTexture, verifyTarget);
			Texture::SubImage(gl, verifyTarget, 0, 0, 0, 0, width, height, 0, GL_RED, GL_UNSIGNED_BYTE,
							  (GLvoid*)out_data);
			GLU_EXPECT_NO_ERROR(gl.getError(), "Texture::SubImage");

			std::string vertex   = stc_vertex_common;
			std::string fragment = stc_fragment_lookupResidency;

			// Adjust shader source to texture format
			TokenStringsExt s = createLookupShaderTokens(target, format, level, sample, f);

			replaceToken("<COORD_TYPE>", s.coordType.c_str(), vertex);

			replaceToken("<FUNCTION>", f.name.c_str(), fragment);
			replaceToken("<ARGUMENTS>", f.arguments.c_str(), fragment);

			replaceToken("<OUTPUT_TYPE>", s.outputType.c_str(), fragment);
			replaceToken("<INPUT_TYPE>", s.inputType.c_str(), fragment);
			replaceToken("<SIZE_DEF>", s.sizeDef.c_str(), fragment);
			replaceToken("<LOD>", s.lod.c_str(), fragment);
			replaceToken("<LOD_DEF>", s.lodDef.c_str(), fragment);
			replaceToken("<COORD_TYPE>", s.coordType.c_str(), fragment);
			replaceToken("<ICOORD_TYPE>", s.iCoordType.c_str(), fragment);
			replaceToken("<COORD_DEF>", s.coordDef.c_str(), fragment);
			replaceToken("<POINT_TYPE>", s.pointType.c_str(), fragment);
			replaceToken("<POINT_DEF>", s.pointDef.c_str(), fragment);
			replaceToken("<RETURN_TYPE>", s.returnType.c_str(), fragment);
			replaceToken("<RESULT_EXPECTED>", s.resultExpected.c_str(), fragment);
			replaceToken("<EPSILON>", s.epsilon.c_str(), fragment);
			replaceToken("<SAMPLE_DEF>", s.sampleDef.c_str(), fragment);
			replaceToken("<REFZ_DEF>", s.refZDef.c_str(), fragment);
			replaceToken("<POINT_COORD>", s.pointCoord.c_str(), fragment);
			replaceToken("<COMPONENT_DEF>", s.componentDef.c_str(), fragment);
			replaceToken("<CUBE_MAP_COORD_DEF>", s.cubeMapCoordDef.c_str(), fragment);
			replaceToken("<OFFSET_ARRAY_DEF>", s.offsetArrayDef.c_str(), fragment);
			replaceToken("<FORMAT_DEF>", s.formatDef.c_str(), fragment);
			replaceToken("<OFFSET_TYPE>", s.offsetType.c_str(), fragment);
			replaceToken("<NOFFSET_TYPE>", s.nOffsetType.c_str(), fragment);
			replaceToken("<OFFSET_DIM>", s.offsetDim.c_str(), fragment);

			replaceToken("<TEX_WIDTH>", de::toString(width).c_str(), fragment);
			replaceToken("<TEX_HEIGHT>", de::toString(height).c_str(), fragment);
			replaceToken("<TEX_DEPTH>", de::toString(depth).c_str(), fragment);

			ProgramSources sources = makeVtxFragSources(vertex.c_str(), fragment.c_str());

			// Build and run shader
			ShaderProgram program(m_context.getRenderContext(), sources);
			if (program.isOk())
			{
				gl.useProgram(program.getProgram());
				GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgram");

				// Pass input sampler/image to shader
				gl.activeTexture(GL_TEXTURE0);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glActiveTexture");
				gl.uniform1i(1, 0 /* sampler_unit */);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glUniform1i");

				// Pass committed region width to shader
				gl.uniform1i(2, widthCommitted /* committed region width */);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glUniform1i");

				gl.bindTexture(target, texture);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTexture");

				gl.clear(GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT);
				draw(target, z, program);

				Texture::Bind(gl, verifyTexture, verifyTarget);
				Texture::GetData(gl, 0, verifyTarget, GL_RED, GL_UNSIGNED_BYTE, (GLvoid*)out_data);
				GLU_EXPECT_NO_ERROR(gl.getError(), "Texture::GetData");

				//Verify only committed region
				for (GLint y = 0; y < height; ++y)
					for (GLint x = 0; x < width; ++x)
					{
						GLubyte* dataRegion	= exp_data + x + y * width;
						GLubyte* outDataRegion = out_data + x + y * width;
						if (dataRegion[0] != outDataRegion[0])
							result = false;
					}
			}
			else
			{
				mLog << "Shader compilation failed (lookup residency) for target: " << target << ", format: " << format
					 << ", vertexInfoLog: " << program.getShaderInfo(SHADERTYPE_VERTEX).infoLog
					 << ", fragmentInfoLog: " << program.getShaderInfo(SHADERTYPE_FRAGMENT).infoLog
					 << ", programInfoLog: " << program.getProgramInfo().infoLog
					 << ", fragmentSource: " << fragment.c_str() << " - ";

				result = false;
			}
		}
	}

	gl.bindFramebuffer(GL_FRAMEBUFFER, 0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindFramebuffer");

	Texture::Delete(gl, verifyTexture);

	return result;
}